

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Function<kj::MainBuilder::Validity_()> * __thiscall
kj::_::NullableValue<kj::Function<kj::MainBuilder::Validity()>>::
emplace<kj::Function<kj::MainBuilder::Validity()>>
          (NullableValue<kj::Function<kj::MainBuilder::Validity()>> *this,
          Function<kj::MainBuilder::Validity_()> *params)

{
  Function<kj::MainBuilder::Validity_()> *params_00;
  Function<kj::MainBuilder::Validity_()> *params_local;
  NullableValue<kj::Function<kj::MainBuilder::Validity_()>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::Function<kj::MainBuilder::Validity()>>)0x0;
    dtor<kj::Function<kj::MainBuilder::Validity()>>
              ((Function<kj::MainBuilder::Validity_()> *)(this + 8));
  }
  params_00 = fwd<kj::Function<kj::MainBuilder::Validity()>>(params);
  ctor<kj::Function<kj::MainBuilder::Validity()>,kj::Function<kj::MainBuilder::Validity()>>
            ((Function<kj::MainBuilder::Validity_()> *)(this + 8),params_00);
  *this = (NullableValue<kj::Function<kj::MainBuilder::Validity()>>)0x1;
  return (Function<kj::MainBuilder::Validity_()> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }